

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubwordLearner.cc
# Opt level: O2

void __thiscall
onmt::SubwordLearner::SubwordLearner(SubwordLearner *this,bool verbose,Tokenizer *default_tokenizer)

{
  Tokenizer *this_00;
  allocator<char> local_62;
  allocator<char> local_61;
  string local_60;
  string local_40;
  
  this->_vptr_SubwordLearner = (_func_int **)&PTR__SubwordLearner_003b5ff0;
  this->_verbose = verbose;
  this_00 = default_tokenizer;
  if (default_tokenizer == (Tokenizer *)0x0) {
    this_00 = (Tokenizer *)operator_new(0xc0);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"",&local_61);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"",&local_62);
    Tokenizer::Tokenizer
              (this_00,None,0x100,&local_40,(string *)Tokenizer::joiner_marker_abi_cxx11_,&local_60,
               0x32);
  }
  std::__shared_ptr<onmt::Tokenizer_const,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<onmt::Tokenizer_const,void>
            ((__shared_ptr<onmt::Tokenizer_const,(__gnu_cxx::_Lock_policy)2> *)
             &this->_default_tokenizer,this_00);
  if (default_tokenizer == (Tokenizer *)0x0) {
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return;
}

Assistant:

SubwordLearner::SubwordLearner(bool verbose, const Tokenizer* default_tokenizer)
    : _verbose(verbose)
    , _default_tokenizer(default_tokenizer
                         ? default_tokenizer
                         : new Tokenizer(Tokenizer::Mode::None, Tokenizer::Flags::NoSubstitution))
  {
  }